

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O0

string * __thiscall slang::TimeScale::toString_abi_cxx11_(TimeScale *this)

{
  value<fmt::v11::context> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined1 in_stack_00000160 [16];
  undefined1 in_stack_00000170 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  undefined1 local_d8 [16];
  TimeScaleValue *in_stack_ffffffffffffff38;
  undefined1 local_b8 [32];
  char *local_98;
  undefined8 local_90;
  undefined1 local_78 [32];
  undefined8 local_58;
  undefined1 *local_50;
  char *local_48;
  undefined8 uStack_40;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined8 uStack_20;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_98 = "{} / {}";
  local_90 = 7;
  x = in_RDI;
  TimeScaleValue::toString_abi_cxx11_(in_stack_ffffffffffffff38);
  TimeScaleValue::toString_abi_cxx11_(in_stack_ffffffffffffff38);
  local_28 = local_98;
  uStack_20 = local_90;
  local_30 = local_b8;
  local_38 = local_d8;
  local_48 = local_98;
  uStack_40 = local_90;
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RSI,x);
  ::fmt::v11::detail::value<fmt::v11::context>::
  value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
            (in_RSI,x);
  local_8 = &local_58;
  local_10 = local_78;
  local_58 = 0xdd;
  local_50 = local_10;
  ::fmt::v11::vformat_abi_cxx11_((string_view)in_stack_00000170,(format_args)in_stack_00000160);
  std::__cxx11::string::~string(in_RDI);
  std::__cxx11::string::~string(in_RDI);
  return x;
}

Assistant:

std::string TimeScale::toString() const {
    return fmt::format("{} / {}", base.toString(), precision.toString());
}